

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall CConnman::InactivityCheck(CConnman *this,CNode *node)

{
  seconds t;
  seconds t_00;
  seconds t_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  bool bVar1;
  strong_ordering sVar2;
  duration<long,_std::ratio<1L,_1L>_> args;
  duration<long,_std::ratio<1L,_1L>_> args_2;
  duration<long,_std::ratio<1L,_1L>_> args_1;
  rep rVar3;
  type tVar4;
  pointer pTVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1L>_> last_recv;
  duration<long,_std::ratio<1L,_1L>_> last_send;
  duration<long,_std::ratio<1L,_1L>_> now;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  CConnman *in_stack_fffffffffffffdf0;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_fffffffffffffdf8;
  duration<long,_std::ratio<60L,_1L>_> *in_stack_fffffffffffffe00;
  seconds in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  memory_order __m;
  atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  undefined8 in_stack_fffffffffffffe58;
  int iVar7;
  bool local_171;
  ConstevalFormatString<4U> in_stack_fffffffffffffe98;
  string_view in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  Level in_stack_ffffffffffffff90;
  long *args_3;
  char local_3a [34];
  long local_18;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  __m = (memory_order)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  args = GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
  args_2 = std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::load
                     (in_stack_fffffffffffffe18,__m);
  args_1 = std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::load
                     (in_stack_fffffffffffffe18,__m);
  args_3 = (long *)args.__r;
  bVar1 = ShouldRunInactivityChecks
                    (in_stack_fffffffffffffdf0,
                     (CNode *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                     in_stack_fffffffffffffe08);
  if (bVar1) {
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                      ((duration<long,_std::ratio<1L,_1L>_> *)
                       CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    if ((rVar3 == 0) ||
       (rVar3 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                          ((duration<long,_std::ratio<1L,_1L>_> *)
                           CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8)),
       rVar3 == 0)) {
      bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                                  Trace);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe08.__r
                   ,(char *)in_stack_fffffffffffffe00);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe08.__r
                   ,(char *)in_stack_fffffffffffffe00);
        t.__r._4_4_ = in_stack_fffffffffffffdec;
        t.__r._0_4_ = in_stack_fffffffffffffde8;
        count_seconds(t);
        std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                  ((duration<long,_std::ratio<1L,_1L>_> *)
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                  ((duration<long,_std::ratio<1L,_1L>_> *)
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        logging_function._M_str = in_stack_fffffffffffffeb8;
        logging_function._M_len = in_stack_fffffffffffffeb0;
        LogPrintFormatInternal<long,bool,bool,long>
                  (logging_function,in_stack_fffffffffffffea0,iVar7,
                   CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   in_stack_ffffffffffffff90,in_stack_fffffffffffffe98,(long *)args.__r,
                   (bool *)args_1.__r,(bool *)args_2.__r,args_3);
      }
      local_171 = true;
    }
    else {
      std::chrono::operator+
                ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe08.__r,
                 in_stack_fffffffffffffe00);
      sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1L>_>
                        ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8);
      std::__cmp_cat::__unspec::__unspec
                ((__unspec *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                 (__unspec *)0x1002e47);
      bVar1 = std::operator>(sVar2._M_value);
      if (bVar1) {
        bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                                    Trace);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     in_stack_fffffffffffffe08.__r,(char *)in_stack_fffffffffffffe00);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     in_stack_fffffffffffffe08.__r,(char *)in_stack_fffffffffffffe00);
          tVar4 = std::chrono::operator-
                            (in_stack_fffffffffffffdf8,
                             (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffdf0);
          iVar7 = (int)((ulong)tVar4.__r >> 0x20);
          t_00.__r._4_4_ = in_stack_fffffffffffffdec;
          t_00.__r._0_4_ = in_stack_fffffffffffffde8;
          count_seconds(t_00);
          CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
          logging_function_00._M_str = in_stack_fffffffffffffeb8;
          logging_function_00._M_len = in_stack_fffffffffffffeb0;
          LogPrintFormatInternal<long,long>
                    (logging_function_00,in_stack_fffffffffffffea0,iVar7,
                     CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                     in_stack_ffffffffffffff90,
                     (ConstevalFormatString<2U>)in_stack_fffffffffffffe98.fmt,(long *)args.__r,
                     (long *)args_1.__r);
        }
        local_171 = true;
      }
      else {
        std::chrono::operator+
                  ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe08.__r,
                   in_stack_fffffffffffffe00);
        sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1L>_>
                          ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe00,
                           in_stack_fffffffffffffdf8);
        std::__cmp_cat::__unspec::__unspec
                  ((__unspec *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                   (__unspec *)0x1002f9d);
        bVar1 = std::operator>(sVar2._M_value);
        if (bVar1) {
          bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                                      Trace);
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       in_stack_fffffffffffffe08.__r,(char *)in_stack_fffffffffffffe00);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       in_stack_fffffffffffffe08.__r,(char *)in_stack_fffffffffffffe00);
            std::chrono::operator-
                      (in_stack_fffffffffffffdf8,
                       (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffdf0);
            t_01.__r._4_4_ = in_stack_fffffffffffffdec;
            t_01.__r._0_4_ = in_stack_fffffffffffffde8;
            count_seconds(t_01);
            CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
            logging_function_01._M_str = in_stack_fffffffffffffeb8;
            logging_function_01._M_len = in_stack_fffffffffffffeb0;
            LogPrintFormatInternal<long,long>
                      (logging_function_01,in_stack_fffffffffffffea0,iVar7,
                       CONCAT17(sVar2._M_value,in_stack_fffffffffffffe50),in_stack_ffffffffffffff90,
                       (ConstevalFormatString<2U>)in_stack_fffffffffffffe98.fmt,(long *)args.__r,
                       (long *)args_1.__r);
          }
          local_171 = true;
        }
        else {
          bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffe00);
          if (bVar1) {
            local_171 = false;
          }
          else {
            pTVar5 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                               ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                                CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
            (*pTVar5->_vptr_Transport[2])(local_3a);
            if (local_3a[0] == '\0') {
              bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffdec,
                                                   in_stack_fffffffffffffde8),Trace);
              if (bVar1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffe08.__r,(char *)in_stack_fffffffffffffe00);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffe08.__r,(char *)in_stack_fffffffffffffe00);
                pcVar6 = (char *)CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffdec,
                                                                in_stack_fffffffffffffde8));
                logging_function_02._M_str = pcVar6;
                logging_function_02._M_len = in_stack_fffffffffffffeb0;
                LogPrintFormatInternal<long>
                          (logging_function_02,in_stack_fffffffffffffea0,iVar7,
                           CONCAT17(sVar2._M_value,in_stack_fffffffffffffe50),
                           in_stack_ffffffffffffff90,
                           (ConstevalFormatString<1U>)in_stack_fffffffffffffe98.fmt,(long *)args.__r
                          );
              }
            }
            else {
              bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffdec,
                                                   in_stack_fffffffffffffde8),Trace);
              if (bVar1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffe08.__r,(char *)in_stack_fffffffffffffe00);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffe08.__r,(char *)in_stack_fffffffffffffe00);
                CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))
                ;
                logging_function_03._M_str = in_stack_fffffffffffffeb8;
                logging_function_03._M_len = in_stack_fffffffffffffeb0;
                LogPrintFormatInternal<long>
                          (logging_function_03,in_stack_fffffffffffffea0,iVar7,
                           CONCAT17(sVar2._M_value,in_stack_fffffffffffffe50),
                           in_stack_ffffffffffffff90,
                           (ConstevalFormatString<1U>)in_stack_fffffffffffffe98.fmt,(long *)args.__r
                          );
              }
            }
            local_171 = true;
          }
        }
      }
    }
  }
  else {
    local_171 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return local_171;
}

Assistant:

bool CConnman::InactivityCheck(const CNode& node) const
{
    // Tests that see disconnects after using mocktime can start nodes with a
    // large timeout. For example, -peertimeout=999999999.
    const auto now{GetTime<std::chrono::seconds>()};
    const auto last_send{node.m_last_send.load()};
    const auto last_recv{node.m_last_recv.load()};

    if (!ShouldRunInactivityChecks(node, now)) return false;

    if (last_recv.count() == 0 || last_send.count() == 0) {
        LogDebug(BCLog::NET, "socket no message in first %i seconds, %d %d peer=%d\n", count_seconds(m_peer_connect_timeout), last_recv.count() != 0, last_send.count() != 0, node.GetId());
        return true;
    }

    if (now > last_send + TIMEOUT_INTERVAL) {
        LogDebug(BCLog::NET, "socket sending timeout: %is peer=%d\n", count_seconds(now - last_send), node.GetId());
        return true;
    }

    if (now > last_recv + TIMEOUT_INTERVAL) {
        LogDebug(BCLog::NET, "socket receive timeout: %is peer=%d\n", count_seconds(now - last_recv), node.GetId());
        return true;
    }

    if (!node.fSuccessfullyConnected) {
        if (node.m_transport->GetInfo().transport_type == TransportProtocolType::DETECTING) {
            LogDebug(BCLog::NET, "V2 handshake timeout peer=%d\n", node.GetId());
        } else {
            LogDebug(BCLog::NET, "version handshake timeout peer=%d\n", node.GetId());
        }
        return true;
    }

    return false;
}